

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ContinuousAssignSyntax * __thiscall
slang::parsing::Parser::parseContinuousAssign(Parser *this,AttrList attributes)

{
  Token semi_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token assign_00;
  int iVar1;
  DriveStrengthSyntax *strength_00;
  TimingControlSyntax *delay_00;
  undefined4 extraout_var;
  ContinuousAssignSyntax *pCVar2;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  Token TVar3;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> local_1c8;
  DriveStrengthSyntax *local_198;
  Info *pIStack_190;
  pointer local_188;
  size_type sStack_180;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_178;
  anon_class_8_1_8991fb9c local_138;
  undefined4 local_12c;
  undefined1 local_128 [8];
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token semi;
  TimingControlSyntax *delay;
  DriveStrengthSyntax *strength;
  Token assign;
  Parser *this_local;
  AttrList attributes_local;
  
  TVar3 = ParserBase::consume(&this->super_ParserBase);
  strength_00 = parseDriveStrength(this);
  delay_00 = parseDelay3(this);
  Token::Token((Token *)(buffer.stackBase + 0xa0));
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)local_128);
  local_12c = 0x260005;
  local_138.this = this;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon,slang::parsing::Parser::parseContinuousAssign(nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__0>
            (&this->super_ParserBase,(SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_128,
             Semicolon,Comma,(Token *)(buffer.stackBase + 0xa0),True,(DiagCode)0x260005,&local_138,
             False);
  local_188 = attributes.data_;
  sStack_180 = attributes.size_;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (&local_178,attributes);
  strength = TVar3._0_8_;
  assign._0_8_ = TVar3.info;
  local_198 = strength;
  pIStack_190 = (Info *)assign._0_8_;
  iVar1 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_128,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  elements.data_._4_4_ = extraout_var;
  elements.data_._0_4_ = iVar1;
  elements.size_ = extraout_RDX;
  slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            (&local_1c8,elements);
  assign_00.info = pIStack_190;
  assign_00._0_8_ = local_198;
  semi_00.info._0_4_ = semi._0_4_;
  semi_00._0_8_ = buffer.stackBase._160_8_;
  semi_00.info._4_4_ = semi.rawLen;
  pCVar2 = slang::syntax::SyntaxFactory::continuousAssign
                     (&this->factory,&local_178,assign_00,strength_00,delay_00,&local_1c8,semi_00);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)local_128);
  return pCVar2;
}

Assistant:

ContinuousAssignSyntax& Parser::parseContinuousAssign(AttrList attributes) {
    auto assign = consume();
    auto strength = parseDriveStrength();
    auto delay = parseDelay3();

    Token semi;
    SmallVector<TokenOrSyntax, 8> buffer;
    parseList<isPossibleExpressionOrComma, isSemicolon>(
        buffer, TokenKind::Semicolon, TokenKind::Comma, semi, RequireItems::True,
        diag::ExpectedContinuousAssignment, [this] {
            auto& expr = parseExpression();
            if (expr.kind != SyntaxKind::AssignmentExpression)
                addDiag(diag::ExpectedContinuousAssignment, expr.sourceRange());
            return &expr;
        });

    return factory.continuousAssign(attributes, assign, strength, delay, buffer.copy(alloc), semi);
}